

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O1

void __thiscall
cmCommandArgumentsHelper::Parse
          (cmCommandArgumentsHelper *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unconsumedArgs)

{
  bool bVar1;
  int iVar2;
  pointer ppcVar3;
  cmCommandArgument *pcVar4;
  cmCommandArgument *this_00;
  pointer __x;
  cmCommandArgument *current;
  
  if (args != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    for (ppcVar3 = (this->Arguments).
                   super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar3 !=
        (this->Arguments).
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
      cmCommandArgument::ApplyOwnGroup(*ppcVar3);
      pcVar4 = *ppcVar3;
      pcVar4->WasActive = false;
      pcVar4->CurrentIndex = 0;
      (*pcVar4->_vptr_cmCommandArgument[3])();
    }
    __x = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    if (__x != (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar4 = (cmCommandArgument *)0x0;
      current = (cmCommandArgument *)0x0;
      do {
        for (ppcVar3 = (this->Arguments).
                       super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 = pcVar4,
            ppcVar3 !=
            (this->Arguments).
            super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
          if ((((*ppcVar3)->Key == (char *)0x0) || (*(*ppcVar3)->Key == '\0')) ||
             (iVar2 = std::__cxx11::string::compare((char *)__x), iVar2 == 0)) {
            this_00 = *ppcVar3;
            bVar1 = cmCommandArgument::MayFollow(this_00,current);
            if (bVar1) {
              this_00->WasActive = true;
              this_00->CurrentIndex = 0;
              break;
            }
          }
        }
        if (this_00 == (cmCommandArgument *)0x0) {
          if (unconsumedArgs !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(unconsumedArgs,__x);
          }
          pcVar4 = (cmCommandArgument *)0x0;
          this_00 = current;
        }
        else {
          iVar2 = (*this_00->_vptr_cmCommandArgument[2])(this_00,__x,(ulong)this_00->CurrentIndex);
          this_00->CurrentIndex = this_00->CurrentIndex + 1;
          pcVar4 = (cmCommandArgument *)0x0;
          if ((char)iVar2 == '\0') {
            pcVar4 = this_00;
          }
        }
        __x = __x + 1;
        current = this_00;
      } while (__x != (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void cmCommandArgumentsHelper::Parse(const std::vector<std::string>* args,
                                     std::vector<std::string>* unconsumedArgs)
{
  if(args==0)
    {
    return;
    }

  for(std::vector<cmCommandArgument*>::iterator
      argIt = this->Arguments.begin();
      argIt != this->Arguments.end();
      ++argIt)
    {
    (*argIt)->ApplyOwnGroup();
    (*argIt)->Reset();
    }

  cmCommandArgument* activeArgument = 0;
  const cmCommandArgument* previousArgument = 0;
  for(std::vector<std::string>::const_iterator it = args->begin();
      it != args->end();
      ++it)
    {
    for(std::vector<cmCommandArgument*>::iterator
        argIt = this->Arguments.begin();
        argIt != this->Arguments.end();
        ++argIt)
      {
      if ((*argIt)->KeyMatches(*it) && ((*argIt)->MayFollow(previousArgument)))
        {
        activeArgument = *argIt;
        activeArgument->Activate();
        break;
        }
      }

    if (activeArgument)
      {
      bool argDone = activeArgument->Consume(*it);
      previousArgument = activeArgument;
      if (argDone)
        {
        activeArgument = 0;
        }
      }
    else
      {
      if (unconsumedArgs!=0)
        {
        unconsumedArgs->push_back(*it);
        }
      }
    }
}